

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

void do_blindness_dust(CHAR_DATA *ch,char *argument)

{
  CHAR_DATA *pCVar1;
  CHAR_DATA *pCVar2;
  bool bVar3;
  int iVar4;
  CClass *this;
  char *pcVar5;
  CHAR_DATA *in_RDI;
  float fVar6;
  char buf [4608];
  bool fighting;
  float chance;
  AFFECT_DATA af;
  CHAR_DATA *vch_next;
  CHAR_DATA *vch;
  CHAR_DATA *in_stack_ffffffffffffed48;
  CHAR_DATA *in_stack_ffffffffffffed50;
  CHAR_DATA *in_stack_ffffffffffffed58;
  undefined4 in_stack_ffffffffffffed60;
  int in_stack_ffffffffffffed64;
  int in_stack_ffffffffffffed84;
  CHAR_DATA *in_stack_ffffffffffffed88;
  int in_stack_ffffffffffffed90;
  int in_stack_ffffffffffffee24;
  undefined1 in_stack_ffffffffffffee2b;
  int in_stack_ffffffffffffee2c;
  GEN_DATA *in_stack_ffffffffffffee30;
  int in_stack_ffffffffffffee4c;
  CHAR_DATA *in_stack_ffffffffffffee50;
  int in_stack_ffffffffffffef74;
  CHAR_DATA *in_stack_ffffffffffffef78;
  CHAR_DATA *in_stack_ffffffffffffef80;
  CHAR_DATA *local_18;
  
  iVar4 = get_skill(in_stack_ffffffffffffee50,in_stack_ffffffffffffee4c);
  fVar6 = (float)iVar4;
  if ((fVar6 != 0.0) || (NAN(fVar6))) {
    in_stack_ffffffffffffed64 = (int)in_RDI->level;
    in_stack_ffffffffffffed58 = (CHAR_DATA *)(skill_table + gsn_blindness_dust);
    this = char_data::Class((char_data *)
                            CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60));
    iVar4 = CClass::GetIndex(this);
    if (*(short *)((long)&in_stack_ffffffffffffed58->next_in_room + (long)iVar4 * 2) <=
        in_stack_ffffffffffffed64) {
      if (in_RDI->mana < 0x12) {
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60),
                     in_stack_ffffffffffffed58);
        return;
      }
      iVar4 = number_percent();
      if (fVar6 < (float)iVar4) {
        act((char *)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60),
            in_stack_ffffffffffffed58,in_stack_ffffffffffffed50,in_stack_ffffffffffffed48,0);
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60),
                     in_stack_ffffffffffffed58);
        iVar4 = (int)((ulong)in_stack_ffffffffffffed58 >> 0x20);
        in_RDI->mana = in_RDI->mana + -9;
        check_improve((CHAR_DATA *)in_stack_ffffffffffffee30,in_stack_ffffffffffffee2c,
                      (bool)in_stack_ffffffffffffee2b,in_stack_ffffffffffffee24);
        WAIT_STATE((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60),iVar4)
        ;
        return;
      }
      act((char *)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60),
          in_stack_ffffffffffffed58,in_stack_ffffffffffffed50,in_stack_ffffffffffffed48,0);
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60),
                   in_stack_ffffffffffffed58);
      check_improve((CHAR_DATA *)in_stack_ffffffffffffee30,in_stack_ffffffffffffee2c,
                    (bool)in_stack_ffffffffffffee2b,in_stack_ffffffffffffee24);
      pCVar1 = in_RDI->fighting;
      init_affect((AFFECT_DATA *)0x5ebb39);
      std::pow<int,int>(0,0x5ebb97);
      in_RDI->mana = in_RDI->mana + -0x12;
      WAIT_STATE((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60),
                 (int)((ulong)in_stack_ffffffffffffed58 >> 0x20));
      pCVar2 = in_RDI->in_room->people;
      while (local_18 = pCVar2, local_18 != (CHAR_DATA *)0x0) {
        pCVar2 = local_18->next_in_room;
        bVar3 = is_safe(in_stack_ffffffffffffed50,in_stack_ffffffffffffed48);
        if ((((!bVar3) && (bVar3 = is_immortal(in_stack_ffffffffffffed48), !bVar3)) &&
            (bVar3 = is_same_group(in_RDI,local_18), !bVar3)) &&
           (bVar3 = is_same_cabal(in_RDI,local_18), !bVar3)) {
          bVar3 = is_affected_by(in_stack_ffffffffffffed58,
                                 (int)((ulong)in_stack_ffffffffffffed50 >> 0x20));
          if ((!bVar3) &&
             (bVar3 = saves_spell(in_stack_ffffffffffffed90,in_stack_ffffffffffffed88,
                                  in_stack_ffffffffffffed84), !bVar3)) {
            act((char *)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60),
                in_stack_ffffffffffffed58,in_stack_ffffffffffffed50,in_stack_ffffffffffffed48,0);
            send_to_char((char *)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60),
                         in_stack_ffffffffffffed58);
            affect_to_char(in_stack_ffffffffffffed50,(AFFECT_DATA *)in_stack_ffffffffffffed48);
          }
          bVar3 = is_npc(in_stack_ffffffffffffed48);
          if (((!bVar3) && (bVar3 = is_npc(in_stack_ffffffffffffed48), !bVar3)) &&
             ((local_18->fighting == (CHAR_DATA *)0x0 || (pCVar1 == (CHAR_DATA *)0x0)))) {
            in_stack_ffffffffffffed50 = (CHAR_DATA *)&stack0xffffffffffffed68;
            pcVar5 = pers(in_stack_ffffffffffffed58,in_stack_ffffffffffffed50);
            sprintf((char *)in_stack_ffffffffffffed50,"Help! %s just threw dust in my eyes!",pcVar5)
            ;
            do_myell((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60),
                     (char *)in_stack_ffffffffffffed58,in_stack_ffffffffffffed50);
          }
          if (local_18->fighting == (CHAR_DATA *)0x0) {
            multi_hit(in_stack_ffffffffffffef80,in_stack_ffffffffffffef78,in_stack_ffffffffffffef74)
            ;
          }
        }
      }
      return;
    }
  }
  send_to_char((char *)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60),
               in_stack_ffffffffffffed58);
  return;
}

Assistant:

void do_blindness_dust(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *vch;
	CHAR_DATA *vch_next;
	AFFECT_DATA af;
	float chance;
	bool fighting = false;
	char buf[MAX_STRING_LENGTH];

	chance = get_skill(ch, gsn_blindness_dust);

	if (chance == 0
		|| ch->level < skill_table[gsn_blindness_dust].skill_level[ch->Class()->GetIndex()])
	{
		send_to_char("You don't know how to make blindness dust to throw.\n\r", ch);
		return;
	}

	if (ch->mana < 18)
	{
		send_to_char("You don't have the mana.\n\r", ch);
		return;
	}

	if (number_percent() > chance)
	{
		act("$n hurls some dust into the air but it is blown away.", ch, 0, 0, TO_ROOM);
		send_to_char("You throw out some dust but it is blown away.\n\r", ch);
		ch->mana -= 9;
		check_improve(ch, gsn_blindness_dust, false, 2);

		WAIT_STATE(ch, 12);
		return;
	}

	act("$n hurls a handful of dust into the room!", ch, 0, 0, TO_ROOM);
	send_to_char("You throw a handful of blindness dust into the room!\n\r", ch);
	check_improve(ch, gsn_blindness_dust, true, 2);

	if (ch->fighting != nullptr)
		fighting = true;

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = gsn_blindness_dust;
	af.level = ch->level;
	af.duration = ch->level / 10;

	SET_BIT(af.bitvector, AFF_BLIND);

	af.location = APPLY_HITROLL;
	af.modifier = -3;
	af.aftype = AFT_SKILL;
	ch->mana -= 18;
	af.mod_name = MOD_VISION;

	WAIT_STATE(ch, 12);

	for (vch = ch->in_room->people; vch != nullptr; vch = vch_next)
	{
		vch_next = vch->next_in_room;

		if (is_safe(ch, vch) || is_immortal(vch))
			continue;

		if (is_same_group(ch, vch) || is_same_cabal(ch, vch))
			continue;

		if (!is_affected_by(vch, AFF_BLIND) && !saves_spell(ch->level, vch, DAM_OTHER))
		{
			act("$n appears blinded.", vch, 0, 0, TO_ROOM);
			send_to_char("You get dust in your eyes.\n\r", vch);
			affect_to_char(vch, &af);
		}

		if (!is_npc(vch) && !is_npc(ch) && (vch->fighting == nullptr || (!fighting)))
		{
			sprintf(buf, "Help! %s just threw dust in my eyes!", pers(ch, vch));
			do_myell(vch, buf, ch);
		}

		if (vch->fighting == nullptr)
			multi_hit(vch, ch, TYPE_UNDEFINED);
	}
}